

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadDeletedProperty<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  int iVar1;
  undefined6 in_register_00000032;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_28;
  
  iVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar1 != '\0') {
    Read<duckdb::vector<unsigned_long,true>>((type *)&_Stack_28,this);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_28);
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadDeletedProperty(const field_id_t field_id, const char *tag) {
		// Try to read the property. If not present, great!
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return;
		}
		// Otherwise read and discard the value
		(void)Read<T>();
		OnOptionalPropertyEnd(true);
	}